

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_DeleteRootFld<Js::OpLayoutT_ElementC<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementC<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  PropertyId propertyId;
  Var pvVar1;
  
  pvVar1 = GetReg<unsigned_char>(this,playout->Instance);
  propertyId = FunctionBody::GetReferencedPropertyId
                         (*(FunctionBody **)(this + 0x88),(uint)playout->PropertyIdIndex);
  pvVar1 = JavascriptOperators::OP_DeleteRootProperty
                     (pvVar1,propertyId,*(ScriptContext **)(this + 0x78),PropertyOperation_None);
  SetReg<unsigned_char>(this,playout->Value,pvVar1);
  return;
}

Assistant:

void InterpreterStackFrame::OP_DeleteRootFld(const unaligned T * playout)
    {
        Var result = JavascriptOperators::OP_DeleteRootProperty(GetReg(playout->Instance), m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex), GetScriptContext());
        SetReg(playout->Value, result);
    }